

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsp_helper.c
# Opt level: O2

target_ulong helper_dextr_r_w_mips64(target_ulong ac,target_ulong shift,CPUMIPSState_conflict5 *env)

{
  byte *pbVar1;
  uint64_t local_28;
  long local_20;
  ulong local_18;
  
  mipsdsp_rndrashift_acc(&local_28,(uint32_t)ac,(uint)shift & 0x3f,env);
  if ((local_28 + 1 == 0) && (local_20 = local_20 + 1, local_20 == 0)) {
    local_18 = local_18 + 1;
    local_20 = 0;
  }
  if ((((local_18 & 1) != 0) || (local_20 != 0)) && (((local_18 & 1) == 0 || (local_20 != -1)))) {
    pbVar1 = (byte *)((long)&(env->active_tc).DSPControl + 2);
    *pbVar1 = *pbVar1 | 0x80;
  }
  return (long)(int)(local_28 + 1 >> 1);
}

Assistant:

target_ulong helper_dextr_r_w(target_ulong ac, target_ulong shift,
                              CPUMIPSState *env)
{
    uint64_t temp[3];
    uint32_t temp128;

    shift = shift & 0x3F;
    mipsdsp_rndrashift_acc(temp, ac, shift, env);

    temp[0] += 1;
    if (temp[0] == 0) {
        temp[1] += 1;
        if (temp[1] == 0) {
            temp[2] += 1;
        }
    }

    temp128 = temp[2] & 0x01;

    if ((temp128 != 0 || temp[1] != 0) &&
       (temp128 != 1 || temp[1] != ~0ull)) {
        set_DSPControl_overflow_flag(1, 23, env);
    }

    return (int64_t)(int32_t)(temp[0] >> 1);
}